

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

size_type __thiscall
google::
sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::erase(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *this,key_type *key)

{
  int *piVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  nonempty_iterator piVar6;
  size_type sVar7;
  iterator local_78;
  
  find<int>(&local_78,this,key);
  piVar6 = local_78.pos.col_current;
  iVar5._M_current = local_78.pos.row_current._M_current;
  iVar4._M_current = local_78.pos.row_end._M_current;
  iVar3._M_current = local_78.pos.row_begin._M_current;
  local_78.pos.row_begin._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.pos.row_end._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.pos.col_current = (int *)0x0;
  local_78.end.col_current = (nonempty_iterator)0x0;
  local_78.ht = this;
  local_78.pos.row_current._M_current = local_78.pos.row_end._M_current;
  local_78.end.row_begin._M_current = local_78.pos.row_begin._M_current;
  local_78.end.row_end._M_current = local_78.pos.row_end._M_current;
  local_78.end.row_current._M_current = local_78.pos.row_end._M_current;
  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_78);
  if ((((iVar3._M_current == local_78.pos.row_begin._M_current) &&
       (iVar4._M_current == local_78.pos.row_end._M_current)) &&
      (iVar5._M_current == local_78.pos.row_current._M_current)) &&
     ((iVar5._M_current == iVar4._M_current || (piVar6 == local_78.pos.col_current)))) {
    sVar7 = 0;
  }
  else {
    sVar7 = this->num_deleted;
    iVar2 = (this->key_info).delkey;
    if (sVar7 != 0) {
      piVar1 = &(this->key_info).super_Hasher.num_compares_;
      *piVar1 = *piVar1 + 1;
    }
    *piVar6 = -iVar2;
    this->num_deleted = sVar7 + 1;
    (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
         true;
    sVar7 = 1;
  }
  return sVar7;
}

Assistant:

size_type erase(const key_type& key) {
    // First, double-check we're not erasing delkey.
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Erasing the deleted key");
    assert(!settings.use_deleted() || !equals(key, key_info.delkey));
    const_iterator pos = find(key);  // shrug: shouldn't need to be const
    if (pos != end()) {
      assert(!test_deleted(pos));  // or find() shouldn't have returned it
      set_deleted(pos);
      ++num_deleted;
      // will think about shrink after next insert
      settings.set_consider_shrink(true);
      return 1;  // because we deleted one thing
    } else {
      return 0;  // because we deleted nothing
    }
  }